

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

pointVector * __thiscall Image::getBoundaries(pointVector *__return_storage_ptr__,Image *this)

{
  uchar *puVar1;
  int in_R8D;
  Point_<int> local_144;
  int local_13c;
  int local_138;
  int j;
  int i;
  _InputArray local_118;
  Image local_f0;
  intMatrix local_90;
  undefined1 local_78 [8];
  Image edges;
  Image *this_local;
  pointVector *boundaries;
  
  edges._88_8_ = this;
  sobel(&local_f0,this);
  getBinaryMatrix(&local_90,&local_f0);
  Image((Image *)local_78,&local_90);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_90);
  ~Image(&local_f0);
  cv::_InputArray::_InputArray(&local_118,(Mat *)local_78);
  cv::_OutputArray::_OutputArray((_OutputArray *)&i,(Mat *)local_78);
  cv::cvtColor((cv *)&local_118,(_InputArray *)&i,(_OutputArray *)0x6,0,in_R8D);
  cv::_OutputArray::~_OutputArray((_OutputArray *)&i);
  cv::_InputArray::~_InputArray(&local_118);
  j._3_1_ = 0;
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector(__return_storage_ptr__);
  for (local_138 = 0; local_138 < (int)edges._0_4_; local_138 = local_138 + 1) {
    for (local_13c = 0; local_13c < (int)edges._4_4_; local_13c = local_13c + 1) {
      puVar1 = cv::Mat::at<unsigned_char>((Mat *)local_78,local_138,local_13c);
      if (*puVar1 == 0xff) {
        cv::Point_<int>::Point_(&local_144,local_13c,local_138);
        std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::push_back
                  (__return_storage_ptr__,&local_144);
      }
    }
  }
  j._3_1_ = 1;
  ~Image((Image *)local_78);
  return __return_storage_ptr__;
}

Assistant:

pointVector Image::getBoundaries() {
    Image edges(this->sobel().getBinaryMatrix());
    // Fix using the binary matrix
    cv::cvtColor(edges.content, edges.content, cv::COLOR_BGR2GRAY);
    pointVector boundaries;
    for(int i = 0; i<edges.content.rows;++i){
        for(int j=0; j<edges.content.cols;++j){
            if(edges.content.at<uchar>(i,j)==ON)
                boundaries.push_back(cv::Point(j,i));
        }
    }
    return boundaries;
}